

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

void __thiscall pbrt::IPCChannel::~IPCChannel(IPCChannel *this)

{
  if (this->socketFd != -1) {
    Disconnect(this);
  }
  LOCK();
  numActiveChannels = numActiveChannels + -1;
  UNLOCK();
  std::__cxx11::string::~string((string *)&this->port);
  std::__cxx11::string::~string((string *)&this->address);
  return;
}

Assistant:

IPCChannel::~IPCChannel() {
    if (Connected())
        Disconnect();

    if (--numActiveChannels == 0) {
#ifdef PBRT_IS_WINDOWS
        WSACleanup();
#endif
    }
}